

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommylist.h
# Opt level: O2

void tommy_list_insert_tail(tommy_list *list,tommy_node *node,void *data)

{
  long lVar1;
  tommy_list ptVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar2 = *list;
  if (ptVar2 == (tommy_list)0x0) {
    node->prev = node;
    node->next = (tommy_node_struct *)0x0;
  }
  else {
    node->prev = ptVar2->prev;
    ptVar2->prev = node;
    node->next = (tommy_node_struct *)0x0;
    list = &node->prev->next;
  }
  ((tommy_node_struct *)list)->next = node;
  node->data = data;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline void tommy_list_insert_tail(tommy_list* list, tommy_node* node, void* data)
{
	tommy_node* head = tommy_list_head(list);

	if (head)
		tommy_list_insert_tail_not_empty(head, node);
	else
		tommy_list_insert_first(list, node);

	node->data = data;
}